

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrtxml.cpp
# Opt level: O0

void printNoteElements(UString *src,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t srcLen;
  int local_34;
  int32_t i;
  int32_t count;
  int32_t noteLen;
  UChar *note;
  UErrorCode *pUStack_18;
  int32_t capacity;
  UErrorCode *status_local;
  UString *src_local;
  
  _count = (UChar *)0x0;
  if (src != (UString *)0x0) {
    note._4_4_ = src->fLength;
    pUStack_18 = status;
    status_local = (UErrorCode *)src;
    _count = (UChar *)uprv_malloc_63((long)(note._4_4_ << 1));
    iVar2 = getCount(*(UChar **)status_local,status_local[2],UPC_NOTE,pUStack_18);
    UVar1 = U_FAILURE(*pUStack_18);
    if (UVar1 == '\0') {
      for (local_34 = 0; local_34 < iVar2; local_34 = local_34 + 1) {
        srcLen = getAt(*(UChar **)status_local,status_local[2],(UChar **)&count,note._4_4_,local_34,
                       UPC_NOTE,pUStack_18);
        UVar1 = U_FAILURE(*pUStack_18);
        if (UVar1 != '\0') {
          uprv_free_63(_count);
          return;
        }
        if (0 < srcLen) {
          write_tabs(out);
          print(_count,srcLen,"<note>","</note>",pUStack_18);
        }
      }
      uprv_free_63(_count);
    }
    else {
      uprv_free_63(_count);
    }
  }
  return;
}

Assistant:

static void
printNoteElements(const UString *src, UErrorCode *status){

#if UCONFIG_NO_REGULAR_EXPRESSIONS==0 /* donot compile when no RegularExpressions are available */

    int32_t capacity = 0;
    UChar* note = NULL;
    int32_t noteLen = 0;
    int32_t count = 0,i;

    if(src == NULL){
        return;
    }

    capacity = src->fLength;
    note  = (UChar*) uprv_malloc(U_SIZEOF_UCHAR * capacity);

    count = getCount(src->fChars,src->fLength, UPC_NOTE, status);
    if(U_FAILURE(*status)){
        uprv_free(note);
        return;
    }
    for(i=0; i < count; i++){
        noteLen =  getAt(src->fChars,src->fLength, &note, capacity, i, UPC_NOTE, status);
        if(U_FAILURE(*status)){
            uprv_free(note);
            return;
        }
        if(noteLen > 0){
            write_tabs(out);
            print(note, noteLen,"<note>", "</note>", status);
        }
    }
    uprv_free(note);
#else

    fprintf(stderr, "Warning: Could not output comments to XLIFF file. ICU has been built without RegularExpression support.\n");

#endif /* UCONFIG_NO_REGULAR_EXPRESSIONS */

}